

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void expr_to_slot(Parser *psr,uint8_t dest,Node *node)

{
  int target_idx;
  int target_idx_00;
  BcIns ins;
  
  expr_discharge(psr,node);
  switch(node->type) {
  case NODE_PRIM:
    ins = (node->field_1).prim * 0x10000 + (uint)dest * 0x100 + 2;
    break;
  case NODE_CONST:
    ins = (node->field_1).prim * 0x10000 + (uint)dest * 0x100 + 1;
    break;
  case NODE_RELOC:
    *(uint8_t *)((long)psr->vm->fns[psr->scope->fn].ins + (long)(node->field_1).reloc_idx * 4 + 1) =
         dest;
    goto LAB_0010da5e;
  case NODE_NON_RELOC:
    if ((node->field_1).slot == dest) goto LAB_0010da5e;
    ins = (uint)(node->field_1).slot << 0x10 | (uint)dest << 8;
    break;
  case NODE_JMP:
    jmp_ensure_true_falls_through(psr,node);
    target_idx = fn_emit(psr->vm->fns + psr->scope->fn,(uint)dest * 0x100 + 0x30002);
    fn_emit(psr->vm->fns + psr->scope->fn,0x8000011d);
    target_idx_00 = fn_emit(psr->vm->fns + psr->scope->fn,(uint)dest * 0x100 | 0x20002);
    jmp_list_patch(psr,(node->field_1).reloc_idx,target_idx);
    jmp_list_patch(psr,(node->field_1).jmp.false_list,target_idx_00);
    goto LAB_0010da5e;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                  ,0x278,"void expr_to_slot(Parser *, uint8_t, Node *)");
  }
  fn_emit(psr->vm->fns + psr->scope->fn,ins);
LAB_0010da5e:
  node->type = NODE_NON_RELOC;
  (node->field_1).slot = dest;
  return;
}

Assistant:

static void expr_to_slot(Parser *psr, uint8_t dest, Node *node) {
	// Only deal with discharged values
	expr_discharge(psr, node);
	switch (node->type) {
	case NODE_PRIM: {
		// Emit an BC_SET_P instruction
		BcIns ins = bc_new2(BC_SET_P, dest, node->prim);
		fn_emit(psr_fn(psr), ins);
		break;
	}

	case NODE_NON_RELOC:
		// Only emit a MOV if the destination is different from the source slot
		if (node->slot != dest) {
			BcIns ins = bc_new2(BC_MOV, dest, node->slot);
			fn_emit(psr_fn(psr), ins);
		}
		break;

	case NODE_RELOC: {
		// Modify the destination stack slot for the relocatable instruction
		BcIns *ins = &psr_fn(psr)->ins[node->reloc_idx];
		bc_set_arg1(ins, dest);
		break;
	}

	case NODE_CONST: {
		// The only constant type we have at the moment is a number
		BcIns ins = bc_new2(BC_SET_N, dest, node->const_idx);
		fn_emit(psr_fn(psr), ins);
		break;
	}

	case NODE_JMP: {
		// Ensure the true case falls through
		jmp_ensure_true_falls_through(psr, node);

		// Emit a set/jmp/set sequence
		int tcase = fn_emit(psr_fn(psr), bc_new2(BC_SET_P, dest, PRIM_TRUE));
		fn_emit(psr_fn(psr), bc_new1(BC_JMP, JMP_BIAS + 1));
		int fcase = fn_emit(psr_fn(psr), bc_new2(BC_SET_P, dest, PRIM_FALSE));

		// Patch the true and false lists to their respective cases
		jmp_list_patch(psr, node->jmp.true_list, tcase);
		jmp_list_patch(psr, node->jmp.false_list, fcase);
		break;
	}

	default:
		UNREACHABLE();
	}

	// `node` is now a non-reloc in a specific slot
	node->type = NODE_NON_RELOC;
	node->slot = dest;
}